

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in.c
# Opt level: O0

LY_ERR ly_in_new_file(FILE *f,ly_in **in)

{
  int fd;
  LY_ERR ret__;
  ly_in **in_local;
  FILE *f_local;
  
  if (f == (FILE *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","f","ly_in_new_file");
    f_local._4_4_ = LY_EINVAL;
  }
  else if (in == (ly_in **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","in","ly_in_new_file");
    f_local._4_4_ = LY_EINVAL;
  }
  else {
    fd = fileno((FILE *)f);
    f_local._4_4_ = ly_in_new_fd(fd,in);
    if (f_local._4_4_ == LY_SUCCESS) {
      (*in)->type = LY_IN_FILE;
      ((*in)->method).f = f;
      f_local._4_4_ = LY_SUCCESS;
    }
  }
  return f_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_in_new_file(FILE *f, struct ly_in **in)
{
    LY_CHECK_ARG_RET(NULL, f, in, LY_EINVAL);

    LY_CHECK_RET(ly_in_new_fd(fileno(f), in));

    /* convert the LY_IN_FD input handler into the LY_IN_FILE */
    (*in)->type = LY_IN_FILE;
    (*in)->method.f = f;

    return LY_SUCCESS;
}